

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardrtn.c
# Opt level: O0

FX * make_FXcopy(FX *fx68k)

{
  ushort uVar1;
  bool bVar2;
  DLword DVar3;
  DLword DVar4;
  LispPTR LVar5;
  int nw;
  StackWord *start68k;
  LispPTR *pLVar6;
  FX *pFVar7;
  int local_50;
  DLword local_48;
  DLword local_44;
  Bframe *retbf68k;
  DLword *new68k;
  int nametbl_on_stk;
  int size;
  FX *fx68k_local;
  
  bVar2 = false;
  uVar1 = fx68k->nextblock;
  LVar5 = LAddrFromNative(fx68k);
  nw = ((uint)uVar1 - (LVar5 & 0xffff)) + 2;
  DVar4 = (DLword)nw;
  if (((*(ushort *)&fx68k->field_0x2 >> 9 & 1) == 0) || (fx68k->nametable >> 0x10 != 1)) {
    retbf68k = (Bframe *)freestackblock(DVar4,(StackWord *)(MachineState.pvar + -10),-1);
  }
  else {
    bVar2 = true;
    start68k = (StackWord *)(MachineState.pvar + -10);
    DVar3 = StackOffsetFromNative(fx68k);
    retbf68k = (Bframe *)freestackblock(DVar4,start68k,(int)(DVar3 - 2) % 4);
  }
  if (retbf68k == (Bframe *)0x0) {
    fx68k_local = (FX *)0x0;
  }
  else {
    blt(&retbf68k->ivar,&fx68k[-1].clink,nw);
    *(ushort *)&retbf68k->field_0x2 = *(ushort *)&retbf68k->field_0x2 & 0xfdff | 0x200;
    fx68k_local = (FX *)(retbf68k + 1);
    DVar3 = StackOffsetFromNative(fx68k_local);
    *(DLword *)&retbf68k[3].field_0x2 = DVar3 + DVar4 + -2;
    if (((undefined1  [20])*fx68k & (undefined1  [20])0x1) == (undefined1  [20])0x0) {
      LVar5 = LAddrFromNative(&fx68k[-1].clink);
      local_44 = (DLword)LVar5;
    }
    else {
      local_44 = fx68k->blink;
    }
    pLVar6 = NativeAligned4FromStackOffset(local_44);
    if (((undefined1  [20])*fx68k & (undefined1  [20])0x1) == (undefined1  [20])0x0) {
      LVar5 = LAddrFromNative(&fx68k[-1].clink);
      local_48 = (DLword)LVar5;
    }
    else {
      local_48 = fx68k->blink;
    }
    *(DLword *)&retbf68k[5].field_0x2 = local_48;
    if (((undefined1  [20])*fx68k_local & (undefined1  [20])0x1) == (undefined1  [20])0x0) {
      retbf68k[5].ivar = fx68k_local->alink;
      *(uint *)fx68k_local = (uint)*(Bframe *)fx68k_local & 0xfffffffe | 1;
    }
    *(ushort *)&retbf68k[1].field_0x2 = *(ushort *)&retbf68k[1].field_0x2 & 0xff00;
    if (bVar2) {
      retbf68k[4] = (Bframe)((int)retbf68k[4] + (int)((ulong)((long)fx68k_local - (long)fx68k) >> 1)
                            );
    }
    *(ushort *)((long)pLVar6 + 2) =
         *(ushort *)((long)pLVar6 + 2) & 0xff00 | (*(ushort *)((long)pLVar6 + 2) & 0xff) + 1 & 0xff;
    if (((undefined1  [20])*fx68k & (undefined1  [20])0x1) == (undefined1  [20])0x0) {
      DVar4 = StackOffsetFromNative(&fx68k[-1].clink);
      fx68k->blink = DVar4;
      fx68k->clink = fx68k->alink;
      *(uint *)fx68k = *(uint *)fx68k & 0xfffffffe | 1;
    }
    if (((undefined1  [20])*fx68k & (undefined1  [20])0x1) == (undefined1  [20])0x0) {
      DVar4 = fx68k->alink;
    }
    else {
      DVar4 = fx68k->clink;
    }
    pFVar7 = (FX *)NativeAligned4FromStackOffset(DVar4 - 10);
    incusecount68k(pFVar7);
    if (((undefined1  [20])*fx68k & (undefined1  [20])0x1) == (undefined1  [20])0x0) {
      uVar1 = fx68k->alink;
    }
    else {
      uVar1 = fx68k->clink;
    }
    local_50 = uVar1 - 10;
    if (local_50 != (fx68k->alink & 0xfffe) - 10) {
      pFVar7 = (FX *)NativeAligned4FromStackOffset((fx68k->alink & 0xfffe) - 10);
      incusecount68k(pFVar7);
    }
    decusecount68k(fx68k);
    if ((*(uint *)(MachineState.pvar + -10) & 1) == 0) {
      LVar5 = LAddrFromNative(MachineState.pvar + -0xc);
      MachineState.pvar[-1] = (DLword)LVar5;
    }
    DVar4 = StackOffsetFromNative(fx68k_local);
    MachineState.pvar[-2] = DVar4 + 10;
    MachineState.pvar[-10] = MachineState.pvar[-2] + 1;
  }
  return fx68k_local;
}

Assistant:

static FX *make_FXcopy(FX *fx68k) {
  int size;
  int nametbl_on_stk = NIL;
  DLword *new68k;
  Bframe *retbf68k;

#ifdef FLIPCURSOR
  flip_cursorbar(5);
#endif

  CHECK_FX(fx68k);
  size = FX_size(fx68k) + DLWORDSPER_CELL;
#ifdef BIGVM
  if (fx68k->validnametable && ((fx68k->nametable >> 16) == STK_HI))
#else
  if (fx68k->validnametable && (fx68k->hi2nametable == STK_HI))
#endif /* BIGVM */
  {
/* frame contains a name table, so we care that the alignment
 of the new block be same as old */
#ifdef STACKCHECK
    {
      DLword n;
#ifdef BIGVM
      n = fx68k->nametable & 0xFFFF;
#else
      n = fx68k->lonametable;
#endif /* BIGVM */
      if ((n <= StackOffsetFromNative(fx68k)) && (n >= fx68k->nextblock))
        error("hardreturn:nametable check");
    }
#endif
    nametbl_on_stk = T;
    /* Find a free stack block */
    new68k = freestackblock(size, (StackWord *)CURRENTFX,
                            (StackOffsetFromNative(fx68k) - DLWORDSPER_CELL) % DLWORDSPER_QUAD);
  } /*if end */
  else
    new68k = freestackblock(size, (StackWord *)CURRENTFX, -1); /* No align */

  if (new68k == 0) return (0); /* No more space for STACK */

  /* blt(dest,source,size) */
  blt(new68k, (((DLword *)fx68k) - DLWORDSPER_CELL), size);

  ((Bframe *)new68k)->residual = T;
  new68k = new68k + DLWORDSPER_CELL; /* now NEW points to the FX */
  ((FX *)new68k)->nextblock = (StackOffsetFromNative(new68k) + size) - DLWORDSPER_CELL;
  retbf68k = (Bframe *)NativeAligned4FromStackOffset(GETBLINK(fx68k));
  /* Set true BFptr,not the residual */
  SETBLINK(new68k, GETBLINK(fx68k));
  ((FX *)new68k)->usecount = 0;
  CHECK_BF(retbf68k);

#ifdef BIGVM
  if (nametbl_on_stk) ((FX *)new68k)->nametable += (((UNSIGNED)new68k - (UNSIGNED)fx68k) >> 1);
#else
  if (nametbl_on_stk) ((FX *)new68k)->lonametable += (((UNSIGNED)new68k - (UNSIGNED)fx68k) >> 1);
#endif
  /* increment use count of basic frame of returnee because
  we made another FX which points to it */
  retbf68k->usecnt++;
  SET_FASTP_NIL(fx68k);
  /* increment use count of CLINK of returnee
     because we made a copy of returnee */
  incusecount68k((FX *)NativeAligned4FromStackOffset(GETCLINK(fx68k)));

  if (GETCLINK(fx68k) != GETALINK(fx68k)) {
    incusecount68k((FX *)NativeAligned4FromStackOffset(GETALINK(fx68k)));
  }

  decusecount68k(fx68k); /* if usecon==0  -> FSB */
  SETACLINK(CURRENTFX, StackOffsetFromNative(new68k));
  CHECK_FX((FX *)new68k);
  CHECK_FX(CURRENTFX);
#ifdef STACKCHECK
  stack_check(0);
#endif
#ifdef FLIPCURSOR
  flip_cursorbar(5);
#endif

  return ((FX *)new68k);
}